

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_64.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  longlong lVar5;
  __m128i *palVar6;
  uint uVar7;
  __m128i *ptr;
  int64_t *ptr_00;
  ulong uVar8;
  uint uVar9;
  ulong extraout_RDX;
  int *array;
  int32_t in_R9D;
  longlong extraout_XMM0_Qa;
  parasail_result_t *extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  parasail_result_t *extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  ulong extraout_XMM0_Qa_08;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  ulong extraout_XMM0_Qb_04;
  ulong extraout_XMM0_Qb_05;
  ulong extraout_XMM0_Qb_06;
  ulong uVar10;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i alVar11;
  __m128i alVar12;
  __m128i vH_00;
  __m128i vH_01;
  undefined8 in_stack_fffffffffffffba8;
  ulong local_438;
  long local_430;
  long local_428;
  longlong lStack_418;
  __m128i vH_1;
  int64_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_64_t e;
  __m128i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int local_330;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int64_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_2b0;
  int32_t end_ref;
  int32_t end_query;
  int s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_64","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile64).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_64",
            "profile->profile64.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_64",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_striped_profile_sse41_128_64",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_64","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_striped_profile_sse41_128_64","s2Len")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_striped_profile_sse41_128_64","open")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_striped_profile_sse41_128_64","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_2b0 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    uVar7 = (iVar1 + 1) / 2;
    if (-open < ppVar2->min) {
      alVar12[1] = (long)open;
    }
    else {
      alVar12[1] = -(long)ppVar2->min;
    }
    result = (parasail_result_t *)(alVar12[1] + -0x7fffffffffffffff);
    vSaturationCheckMax[1] = 0x7ffffffffffffffe - (long)ppVar2->max;
    vSaturationCheckMax[0] = (longlong)result;
    _segNum = (parasail_profile_t *)parasail_result_new_table1(uVar7 * 2,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x2800801;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      pvHLoad = parasail_memalign___m128i(0x10,(long)(int)uVar7);
      pvE = parasail_memalign___m128i(0x10,(long)(int)uVar7);
      ptr = parasail_memalign___m128i(0x10,(long)(int)uVar7);
      vH_01[0] = (size_t)(s2Len + 1);
      array = (int *)0x10;
      ptr_00 = parasail_memalign_int64_t(0x10,vH_01[0]);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int64_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        local_438 = extraout_RDX;
        for (k = 0; k < (int)uVar7; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 2; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            uVar9 = h.m[1]._0_4_ * uVar7 + k;
            local_438 = (ulong)uVar9;
            local_430 = (long)(int)(-(gap * uVar9) - open);
            local_428 = local_430;
            if (local_430 < -0x8000000000000000) {
              local_428 = -0x8000000000000000;
            }
            *(long *)((long)&e + (long)(int)h.m[1]._0_4_ * 8 + 8) = local_428;
            local_430 = local_430 - open;
            if (local_430 < -0x8000000000000000) {
              local_430 = -0x8000000000000000;
            }
            (&tmp)[(int)h.m[1]._0_4_] = local_430;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          local_438 = (ulong)(-(gap * (k + -1)) - open);
          if ((long)local_438 < -0x8000000000000000) {
            local_438 = 0x8000000000000000;
          }
          ptr_00[k] = local_438;
        }
        for (s1Len = 0; palVar6 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          vH_01[0] = (size_t)s1Len;
          local_438 = (ulong)uVar7;
          pvE = pvHLoad;
          pvHLoad = palVar6;
          for (k = 0; k < (int)uVar7; k = k + 1) {
            alVar12[1] = (long)k * 0x10;
            alVar11[1] = vH_01[0];
            alVar11[0] = (longlong)array;
            alVar12[0] = local_438;
            alVar11 = _mm_max_epi64_rpl(alVar11,alVar12);
            b[0] = alVar11[1];
            a[1] = vH_01[0];
            a[0] = (longlong)array;
            b[1] = alVar12[1];
            alVar12 = _mm_max_epi64_rpl(a,b);
            b_00[0] = alVar12[1];
            b_00[1] = (long)k * 0x10;
            palVar6[k][0] = extraout_XMM0_Qa;
            palVar6[k][1] = extraout_XMM0_Qb;
            a_00[1] = vH_01[0];
            a_00[0] = (longlong)array;
            alVar12 = _mm_max_epi64_rpl(a_00,b_00);
            b_01[0] = alVar12[1];
            a_01[1] = vH_01[0];
            a_01[0] = (longlong)array;
            b_01[1] = b_00[1];
            result = extraout_XMM0_Qa_00;
            vSaturationCheckMax[0] = extraout_XMM0_Qb_00;
            alVar12 = _mm_min_epi64_rpl(a_01,b_01);
            b_02[0] = alVar12[1];
            a_02[1] = vH_01[0];
            a_02[0] = (longlong)array;
            b_02[1] = b_00[1];
            alVar12 = _mm_min_epi64_rpl(a_02,b_02);
            b_03[0] = alVar12[1];
            a_03[1] = vH_01[0];
            a_03[0] = (longlong)array;
            b_03[1] = b_00[1];
            _mm_min_epi64_rpl(a_03,b_03);
            array = ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->rowcols->
                    score_row;
            vH_00[0] = (size_t)(uint)k;
            uVar8 = (ulong)(uint)s1Len;
            vH_00[1]._0_4_ = uVar7;
            vH_00[1]._4_4_ = 0;
            vSaturationCheckMax[1] = extraout_XMM0_Qa_01;
            arr_store_si128(array,vH_00,s1Len,s2Len,in_R9D,(int32_t)in_stack_fffffffffffffba8);
            a_04[1] = vH_00[0];
            a_04[0] = (longlong)array;
            b_04[1] = uVar8;
            b_04[0] = extraout_RDX_00;
            alVar12 = _mm_max_epi64_rpl(a_04,b_04);
            b_05[0] = alVar12[1];
            b_05[1] = (long)k * 0x10;
            ptr[k][0] = extraout_XMM0_Qa_02;
            ptr[k][1] = extraout_XMM0_Qb_01;
            a_05[1] = vH_00[0];
            a_05[0] = (longlong)array;
            alVar12 = _mm_max_epi64_rpl(a_05,b_05);
            local_438 = alVar12[1];
            vH_01[0] = vH_00[0];
          }
          for (end_query = 0; end_query < 2; end_query = end_query + 1) {
            for (k = 0; k < (int)uVar7; k = k + 1) {
              b_06[1] = (long)k * 0x10;
              a_06[1] = vH_01[0];
              a_06[0] = (longlong)array;
              b_06[0] = local_438;
              alVar12 = _mm_max_epi64_rpl(a_06,b_06);
              b_07[0] = alVar12[1];
              b_07[1] = (long)k * 0x10;
              palVar6[k][0] = extraout_XMM0_Qa_03;
              palVar6[k][1] = extraout_XMM0_Qb_02;
              a_07[1] = vH_01[0];
              a_07[0] = (longlong)array;
              alVar12 = _mm_min_epi64_rpl(a_07,b_07);
              b_08[0] = alVar12[1];
              a_08[1] = vH_01[0];
              a_08[0] = (longlong)array;
              b_08[1] = b_07[1];
              vSaturationCheckMax[1] = extraout_XMM0_Qa_04;
              _mm_max_epi64_rpl(a_08,b_08);
              array = ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->rowcols->
                      score_row;
              vH_01[0] = (size_t)(uint)k;
              uVar8 = (ulong)(uint)s1Len;
              vH_01[1]._0_4_ = uVar7;
              vH_01[1]._4_4_ = 0;
              result = extraout_XMM0_Qa_05;
              vSaturationCheckMax[0] = extraout_XMM0_Qb_03;
              arr_store_si128(array,vH_01,s1Len,s2Len,in_R9D,(int32_t)in_stack_fffffffffffffba8);
              a_09[1] = vH_01[0];
              a_09[0] = (longlong)array;
              b_09[1] = uVar8;
              b_09[0] = extraout_RDX_01;
              alVar12 = _mm_cmpgt_epi64_rpl(a_09,b_09);
              local_438 = alVar12[1];
              auVar4._8_8_ = extraout_XMM0_Qb_04;
              auVar4._0_8_ = extraout_XMM0_Qa_06;
              if ((((((((((((((((auVar4 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar4 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar4 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar4 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar4 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar4 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar4 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar4 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (extraout_XMM0_Qb_04 >> 7 & 1) == 0) &&
                       (extraout_XMM0_Qb_04 >> 0xf & 1) == 0) &&
                      (extraout_XMM0_Qb_04 >> 0x17 & 1) == 0) &&
                     (extraout_XMM0_Qb_04 >> 0x1f & 1) == 0) &&
                    (extraout_XMM0_Qb_04 >> 0x27 & 1) == 0) &&
                   (extraout_XMM0_Qb_04 >> 0x2f & 1) == 0) && (extraout_XMM0_Qb_04 >> 0x37 & 1) == 0
                  ) && -1 < (long)extraout_XMM0_Qb_04) goto LAB_0098d248;
            }
          }
LAB_0098d248:
        }
        alVar12[1] = (long)((iVar1 + -1) % (int)uVar7);
        b_10[1] = alVar12[1] * 0x10;
        lStack_418 = pvHLoad[alVar12[1]][0];
        vH_1[0] = pvHLoad[alVar12[1]][1];
        for (end_query = 0; lVar5 = lStack_418, end_query < (int)(~((iVar1 + -1) / (int)uVar7) + 2U)
            ; end_query = end_query + 1) {
          lStack_418 = 0;
          vH_1[0] = lVar5;
        }
        local_330 = (int)vH_1[0];
        a_10[1] = vH_01[0];
        a_10[0] = (longlong)array;
        b_10[0] = local_438;
        alVar12 = _mm_cmplt_epi64_rpl(a_10,b_10);
        b_11[0] = alVar12[1];
        a_11[1] = vH_01[0];
        a_11[0] = (longlong)array;
        b_11[1] = b_10[1];
        uVar8 = extraout_XMM0_Qa_07;
        _mm_cmpgt_epi64_rpl(a_11,b_11);
        uVar10 = extraout_XMM0_Qb_05 | extraout_XMM0_Qb_06;
        auVar3._8_8_ = uVar10;
        auVar3._0_8_ = uVar8 | extraout_XMM0_Qa_08;
        if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar10 >> 7 & 1) != 0) || (uVar10 >> 0xf & 1) != 0) || (uVar10 >> 0x17 & 1) != 0)
               || (uVar10 >> 0x1f & 1) != 0) || (uVar10 >> 0x27 & 1) != 0) ||
             (uVar10 >> 0x2f & 1) != 0) || (uVar10 >> 0x37 & 1) != 0) || (long)uVar10 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_330 = 0;
          local_2b0 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = local_330;
        *(int *)((long)&_segNum->s1 + 4) = local_2b0;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}